

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadTorus.h
# Opt level: O2

void __thiscall
pzgeom::TPZQuadTorus::GradX<double>
          (TPZQuadTorus *this,TPZFMatrix<double> *cornerco,TPZVec<double> *par,
          TPZFMatrix<double> *gradx)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  TPZManVector<double,_3> ft;
  double local_1b8;
  TPZFNMatrix<6,_double> DxDphi;
  TPZFNMatrix<6,_double> gradphi;
  
  gradphi.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<6,_double>::TPZFNMatrix(&DxDphi,3,2,(double *)&gradphi);
  TPZFNMatrix<6,_double>::TPZFNMatrix(&gradphi,2,2);
  local_1b8 = 0.0;
  TPZManVector<double,_3>::TPZManVector(&ft,3,&local_1b8);
  TPZGeoQuad::X<double>(&(this->fPhiTheta).super_TPZFMatrix<double>,par,&ft.super_TPZVec<double>);
  TPZGeoQuad::GradX<double>
            (&(this->fPhiTheta).super_TPZFMatrix<double>,par,&gradphi.super_TPZFMatrix<double>);
  dVar2 = cos(ft.super_TPZVec<double>.fStore[1]);
  dVar3 = sin(*ft.super_TPZVec<double>.fStore);
  pdVar1 = TPZFMatrix<double>::operator()(&DxDphi.super_TPZFMatrix<double>,0,0);
  *pdVar1 = dVar3 * -dVar2;
  dVar2 = cos(*ft.super_TPZVec<double>.fStore);
  dVar3 = sin(ft.super_TPZVec<double>.fStore[1]);
  pdVar1 = TPZFMatrix<double>::operator()(&DxDphi.super_TPZFMatrix<double>,0,1);
  *pdVar1 = dVar3 * -(dVar2 + 3.0);
  dVar2 = sin(ft.super_TPZVec<double>.fStore[1]);
  dVar3 = sin(*ft.super_TPZVec<double>.fStore);
  pdVar1 = TPZFMatrix<double>::operator()(&DxDphi.super_TPZFMatrix<double>,1,0);
  *pdVar1 = dVar3 * -dVar2;
  dVar2 = cos(ft.super_TPZVec<double>.fStore[1]);
  dVar3 = cos(*ft.super_TPZVec<double>.fStore);
  pdVar1 = TPZFMatrix<double>::operator()(&DxDphi.super_TPZFMatrix<double>,1,1);
  *pdVar1 = dVar2 * (dVar3 + 3.0);
  dVar2 = cos(*ft.super_TPZVec<double>.fStore);
  pdVar1 = TPZFMatrix<double>::operator()(&DxDphi.super_TPZFMatrix<double>,2,0);
  *pdVar1 = dVar2;
  pdVar1 = TPZFMatrix<double>::operator()(&DxDphi.super_TPZFMatrix<double>,2,1);
  *pdVar1 = 0.0;
  TPZMatrix<double>::Multiply
            ((TPZMatrix<double> *)&DxDphi,&gradphi.super_TPZFMatrix<double>,gradx,0);
  TPZManVector<double,_3>::~TPZManVector(&ft);
  TPZFNMatrix<6,_double>::~TPZFNMatrix(&gradphi);
  TPZFNMatrix<6,_double>::~TPZFNMatrix(&DxDphi);
  return;
}

Assistant:

void GradX(TPZFMatrix<REAL> &cornerco, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
        {
            
            
            TPZFNMatrix<6,T> DxDphi(3,2,0.), gradphi(2,2);
            TPZManVector<T,3> ft(3,0.);
            TPZGeoQuad::X(fPhiTheta,par,ft);
            TPZGeoQuad::GradX(fPhiTheta, par, gradphi);
            
            DxDphi(0,0) = -cos(ft[1]) * sin(ft[0]);
            DxDphi(0,1) = -(3. + cos(ft[0])) * sin(ft[1]);
            DxDphi(1,0) = -sin(ft[1]) * sin(ft[0]);
            DxDphi(1,1) = cos(ft[1]) * (3. + cos(ft[0]));
            DxDphi(2,0) = cos(ft[0]);
            DxDphi(2,1) = 0.;
            DxDphi.Multiply(gradphi, gradx);
            
            
        }